

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fec-group.c
# Opt level: O2

int fec_group_decode(fec_group_t *group)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  gf *pkts;
  size_t __size;
  size_t __n;
  long lVar4;
  int iVar5;
  ulong uVar6;
  fec_t *fec;
  uint k;
  size_t sStack_30;
  
  if (group == (fec_group_t *)0x0) {
    sStack_30 = 0x106476;
    __assert_fail("group != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",0x88,
                  "int fec_group_decode(fec_group_t *)");
  }
  if (group->decoded == 0) {
    iVar5 = 0;
    if (group->fec_k <= group->rcvd_pkts) {
      lVar4 = -(ulong)((uint)group->fec_k * 4 + 0xf & 0xfffffff0);
      bVar1 = group->fec_n;
      k = 0;
      for (uVar6 = 0; bVar1 != uVar6; uVar6 = uVar6 + 1) {
        if (group->lengths[uVar6] != 0) {
          *(uint *)((long)(&stack0xffffffffffffffd8 + lVar4) + (long)(int)k * 4) = (uint)uVar6;
          k = k + 1;
          bVar2 = group->fec_k;
          if (k == bVar2) goto LAB_001063dd;
        }
      }
      bVar2 = group->fec_k;
LAB_001063dd:
      if (k != bVar2) {
        *(undefined8 *)((long)&sStack_30 + lVar4) = 0x106495;
        __assert_fail("j == group->fec_k",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0x9f,"int fec_group_decode(fec_group_t *)");
      }
      *(undefined8 *)((long)&sStack_30 + lVar4) = 0x1063ea;
      fec = fec_new(k,(uint)bVar1);
      if (fec == (fec_t *)0x0) {
        *(code **)((long)&sStack_30 + lVar4) = fec_group_decode_to_adus;
        __assert_fail("fec != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/fec-group.c",
                      0xa3,"int fec_group_decode(fec_group_t *)");
      }
      pkts = group->buf;
      uVar3 = group->fec_len;
      *(undefined8 *)((long)&sStack_30 + lVar4) = 0x106409;
      iVar5 = fec_decode(fec,pkts,(uint *)(&stack0xffffffffffffffd8 + lVar4),(uint)uVar3);
      if (iVar5 == 0) {
        *(undefined8 *)((long)&sStack_30 + lVar4) = 0x1b;
        __size = *(size_t *)((long)&sStack_30 + lVar4);
        *(undefined8 *)((long)&sStack_30 + lVar4) = 1;
        __n = *(size_t *)((long)&sStack_30 + lVar4);
        *(undefined8 *)((long)&sStack_30 + lVar4) = 0x10644b;
        fwrite("Could not decode FEC group\n",__size,__n,_stderr);
        *(undefined8 *)((long)&sStack_30 + lVar4) = 0x106453;
        fec_free(fec);
        iVar5 = 0;
      }
      else {
        *(undefined8 *)((long)&sStack_30 + lVar4) = 0x106415;
        fec_free(fec);
        group->decoded = 1;
        *(undefined8 *)((long)&sStack_30 + lVar4) = 1;
        iVar5 = (int)*(undefined8 *)((long)&sStack_30 + lVar4);
      }
    }
  }
  else {
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int fec_group_decode(fec_group_t *group) {
  assert(group != NULL);
  
  if (group->decoded)
    return 1;
  
  /* check if enough packets in the group have been received to
   * recover the complete source data.
   */
  if (group->rcvd_pkts >= group->fec_k) {
    /* we have enough packets in the fec group */
    unsigned int idxs[group->fec_k];

    /* create index array and pointer array. */
    int i, j;
    for (i = 0, j = 0; i < group->fec_n; i++) {
      if (group->lengths[i] > 0) {
        idxs[j] = i;
        j++;
        if (j == group->fec_k)
          break;
      }
    }

    assert(j == group->fec_k);

    /* create the fec structure. */
    fec_t *fec = fec_new(group->fec_k, group->fec_n);
    assert(fec != NULL);

    /* decode the fec group. */
    if (!fec_decode(fec, group->buf, idxs, group->fec_len)) {
      fprintf(stderr, "Could not decode FEC group\n");
      fec_free(fec);
      return 0;
    }

    fec_free(fec);

    group->decoded = 1;

    return 1;
  }  else {
    return 0;
  }
}